

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void __thiscall chrono::turtlebot::Turtlebot_PassiveWheel::Initialize(Turtlebot_PassiveWheel *this)

{
  shared_ptr<chrono::ChBodyAuxRef> *__r;
  double dVar1;
  ChFrame *pCVar2;
  ChSystem *pCVar3;
  element_type *peVar4;
  ChFrame<double> *this_00;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  double mmass;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_298 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  ChVector<double> principal_I;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  string vis_mesh_file;
  ChVector<double> mcog;
  ChFrame<double> X_PC;
  ChFrame<double> X_GC;
  ChMatrix33<double> principal_inertia_rot;
  ChMatrix33<double> minertia;
  ChMatrix33<double> local_68;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&X_GC,
                 "robot/turtlebot/",&(this->super_Turtlebot_Part).m_mesh_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&X_PC,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&X_GC,".obj");
  chrono::GetChronoDataFile((string *)&vis_mesh_file);
  std::__cxx11::string::~string((string *)&X_PC);
  std::__cxx11::string::~string((string *)&X_GC);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&trimesh,SUB81(&vis_mesh_file,0),false);
  peVar4 = trimesh.
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_258 = 0;
  local_268 = 0;
  uStack_260 = 0;
  ChMatrix33<double>::ChMatrix33(&local_68,1.0);
  (**(code **)(*(long *)peVar4 + 0x80))(peVar4,&local_268,&local_68);
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  mcog.m_data[2] = 0.0;
  mcog.m_data[0] = 0.0;
  mcog.m_data[1] = 0.0;
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            ((bool)trimesh.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr._0_1_,(double *)0x1,(ChVector *)&mmass,(ChMatrix33 *)&mcog);
  principal_I.m_data[2] = 0.0;
  principal_I.m_data[0] = 0.0;
  principal_I.m_data[1] = 0.0;
  ChInertiaUtils::PrincipalInertia(&minertia,&principal_I,&principal_inertia_rot);
  pCVar2 = (ChFrame *)
           (this->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ChFrame<double>::ChFrame(&X_PC,&mcog,&principal_inertia_rot);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(mmass * (this->super_Turtlebot_Part).m_density);
  dVar1 = (this->super_Turtlebot_Part).m_density;
  X_PC.coord.pos.m_data[1] = dVar1 * principal_I.m_data[2];
  X_PC._vptr_ChFrame = (_func_int **)(dVar1 * principal_I.m_data[0]);
  X_PC.coord.pos.m_data[0] = dVar1 * principal_I.m_data[1];
  chrono::ChBody::SetInertiaXX
            ((this->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (ChFrame<double> *)
            (**(code **)(*(long *)(this->super_Turtlebot_Part).m_chassis.
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x1f0))();
  ChFrame<double>::ChFrame
            (&X_PC,&(this->super_Turtlebot_Part).m_pos,&(this->super_Turtlebot_Part).m_rot);
  ChFrame<double>::operator*(&X_GC,this_00,&X_PC);
  __r = &(this->super_Turtlebot_Part).m_body;
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs
            ((ChFrame *)
             (__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((this->super_Turtlebot_Part).m_body.
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  Turtlebot_Part::AddCollisionShapes(&this->super_Turtlebot_Part);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c0,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             0x198));
  (**(code **)(*(long *)local_2c0._M_ptr + 200))(local_2c0._M_ptr,3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c0,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             0x198));
  (**(code **)(*(long *)local_2c0._M_ptr + 0xd8))(local_2c0._M_ptr,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
  Turtlebot_Part::AddVisualizationAssets(&this->super_Turtlebot_Part);
  pCVar3 = (this->super_Turtlebot_Part).m_system;
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_298,&__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(pCVar3,local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&vis_mesh_file);
  return;
}

Assistant:

void Turtlebot_PassiveWheel::Initialize() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(ChVector<>(0, 0, 0), ChMatrix33<>(1));  // scale to a different size
    trimesh->RepairDuplicateVertexes(1e-9);                    // if meshes are not watertight

    double mmass;
    ChVector<> mcog;
    ChMatrix33<> minertia;
    trimesh->ComputeMassProperties(true, mmass, mcog, minertia);
    ChMatrix33<> principal_inertia_rot;
    ChVector<> principal_I;
    ChInertiaUtils::PrincipalInertia(minertia, principal_I, principal_inertia_rot);

    m_body->SetFrame_COG_to_REF(ChFrame<>(mcog, principal_inertia_rot));

    // Set inertia
    m_body->SetMass(mmass * m_density);
    m_body->SetInertiaXX(m_density * principal_I);

    // set relative position to chassis
    const ChFrame<>& X_GP = m_chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(m_pos, m_rot);                              // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                              // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);
    m_body->SetBodyFixed(m_fixed);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::PASSIVE_WHEEL);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);

    AddVisualizationAssets();

    m_system->Add(m_body);
}